

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiContext_conflict1 *pIVar1;
  ImGuiWindow_conflict *window;
  
  pIVar1 = GImGui;
  window = GImGui->NavWindow;
  if (layer == ImGuiNavLayer_Main) {
    window = NavRestoreLastChildNavWindow(window);
    pIVar1->NavWindow = window;
  }
  if (window->NavLastIds[layer] == 0) {
    pIVar1->NavLayer = layer;
    NavInitWindow(window,true);
  }
  else {
    SetNavID(window->NavLastIds[layer],layer,0,window->NavRectRel + layer);
  }
  pIVar1->NavMousePosDirty = true;
  pIVar1->NavDisableHighlight = false;
  pIVar1->NavDisableMouseHover = true;
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
    g.NavDisableHighlight = false;
    g.NavDisableMouseHover = g.NavMousePosDirty = true;
}